

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<std::vector<int,std::allocator<int>>>::
resolve<QtPromisePrivate::PromiseValue<std::vector<int,std::allocator<int>>>const&>
          (PromiseResolver<std::vector<int,std::allocator<int>>> *this,
          PromiseValue<std::vector<int,_std::allocator<int>_>_> *value)

{
  QPromise<std::vector<int,_std::allocator<int>_>_> *pQVar1;
  Data *pDVar2;
  PromiseData<std::vector<int,_std::allocator<int>_>_> *pPVar3;
  QPromise<std::vector<int,_std::allocator<int>_>_> *promise;
  PromiseValue<std::vector<int,_std::allocator<int>_>_> *value_local;
  PromiseResolver<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
           ::operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::Data>
                         *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<std::vector<int,_std::allocator<int>_>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d
                         );
    PromiseData<std::vector<int,std::allocator<int>>>::
    resolve<QtPromisePrivate::PromiseValue<std::vector<int,std::allocator<int>>>const&>
              ((PromiseData<std::vector<int,std::allocator<int>>> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d
                         );
    PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
    ::dispatch(&pPVar3->
                super_PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
              );
    PromiseResolver<std::vector<int,_std::allocator<int>_>_>::release
              ((PromiseResolver<std::vector<int,_std::allocator<int>_>_> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }